

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

void mxx::custom_op<char>::custom_function<std::bit_or<char>>
               (long param_1,long param_2,int *param_3,undefined8 *param_4)

{
  void *__src;
  int iVar1;
  long lVar2;
  char inout_buf;
  char in_buf;
  MPI_Aint true_lb;
  MPI_Aint true_extent;
  byte local_42 [2];
  long local_40;
  size_t local_38;
  
  if ((1 < *param_3) && (1 < *param_3)) {
    lVar2 = 0;
    do {
      *(byte *)(param_2 + lVar2) = *(byte *)(param_2 + lVar2) | *(byte *)(param_1 + lVar2);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)*param_3 + -1);
  }
  MPI_Type_get_true_extent(*param_4,&local_40,&local_38);
  iVar1 = *param_3;
  memcpy(local_42 + local_40 + 1,(void *)(param_1 + iVar1 + -1),local_38);
  __src = (void *)(param_2 + -1 + (long)iVar1);
  memcpy(local_42 + local_40,__src,local_38);
  local_42[0] = local_42[0] | local_42[1];
  memcpy(__src,local_42 + local_40,local_38);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }